

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFindFile.cpp
# Opt level: O2

bool CascFindNextFile(HANDLE hFind,PCASC_FIND_DATA pFindData)

{
  bool bVar1;
  TCascSearch *pSearch;
  
  pSearch = IsValidSearchHandle(hFind);
  if (pFindData == (PCASC_FIND_DATA)0x0 || pSearch == (TCascSearch *)0x0) {
    SetLastError(0x16);
    return false;
  }
  bVar1 = DoStorageSearch(pSearch,pFindData);
  return bVar1;
}

Assistant:

bool WINAPI CascFindNextFile(
    HANDLE hFind,
    PCASC_FIND_DATA pFindData)
{
    TCascSearch * pSearch;

    pSearch = IsValidSearchHandle(hFind);
    if(pSearch == NULL || pFindData == NULL)
    {
        SetLastError(ERROR_INVALID_PARAMETER);
        return false;
    }

    // Perform search
    return DoStorageSearch(pSearch, pFindData);
}